

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Backup.cpp
# Opt level: O0

void __thiscall
SQLite::Backup::Backup
          (Backup *this,Database *aDestDatabase,char *apDestDatabaseName,Database *aSrcDatabase,
          char *apSrcDatabaseName)

{
  bool bVar1;
  sqlite3 *psVar2;
  sqlite3 *pSrcDb;
  sqlite3_backup *__p;
  Exception *this_00;
  char *apSrcDatabaseName_local;
  Database *aSrcDatabase_local;
  char *apDestDatabaseName_local;
  Database *aDestDatabase_local;
  Backup *this_local;
  
  std::unique_ptr<sqlite3_backup,SQLite::Backup::Deleter>::unique_ptr<SQLite::Backup::Deleter,void>
            ((unique_ptr<sqlite3_backup,SQLite::Backup::Deleter> *)this);
  psVar2 = Database::getHandle(aDestDatabase);
  pSrcDb = Database::getHandle(aSrcDatabase);
  __p = sqlite3_backup_init(psVar2,apDestDatabaseName,pSrcDb,apSrcDatabaseName);
  std::unique_ptr<sqlite3_backup,_SQLite::Backup::Deleter>::reset(&this->mpSQLiteBackup,__p);
  bVar1 = std::operator==((nullptr_t)0x0,&this->mpSQLiteBackup);
  if (!bVar1) {
    return;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  psVar2 = Database::getHandle(aDestDatabase);
  Exception::Exception(this_00,psVar2);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

Backup::Backup(Database&    aDestDatabase,
               const char*  apDestDatabaseName,
               Database&    aSrcDatabase,
               const char*  apSrcDatabaseName)
{
    mpSQLiteBackup.reset(sqlite3_backup_init(aDestDatabase.getHandle(),
                                         apDestDatabaseName,
                                         aSrcDatabase.getHandle(),
                                         apSrcDatabaseName));
    if (nullptr == mpSQLiteBackup)
    {
        // If an error occurs, the error code and message are attached to the destination database connection.
        throw SQLite::Exception(aDestDatabase.getHandle());
    }
}